

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_expr.hpp
# Opt level: O1

string * __thiscall
viennamath::rt_unary_expr<viennamath::rt_expression_interface<double>>::deep_str_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  stringstream ss;
  long *local_1c8;
  long local_1c0;
  long local_1b8 [2];
  stringstream local_1a8 [16];
  ostream local_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  (**(code **)(**(long **)((long)this + 0x10) + 0x18))(&local_1c8);
  std::__ostream_insert<char,std::char_traits<char>>(local_198,(char *)local_1c8,local_1c0);
  if (local_1c8 != local_1b8) {
    operator_delete(local_1c8,local_1b8[0] + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_198,"(",1);
  (**(code **)(**(long **)((long)this + 8) + 0x18))(&local_1c8);
  std::__ostream_insert<char,std::char_traits<char>>(local_198,(char *)local_1c8,local_1c0);
  if (local_1c8 != local_1b8) {
    operator_delete(local_1c8,local_1b8[0] + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_198,")",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

std::string deep_str() const
      {
        std::stringstream ss;
        ss << op_->str();
        ss << "(";
        ss << expr_->deep_str();
        ss << ")";
        return ss.str();
      }